

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.h
# Opt level: O3

uint __thiscall Nova::Simplex_Mesh<3>::Add_Element(Simplex_Mesh<3> *this,INDEX *e)

{
  iterator __position;
  pointer pVVar1;
  
  __position._M_current =
       (this->elements)._data.
       super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elements)._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Nova::Vector<int,3,true>,std::allocator<Nova::Vector<int,3,true>>>::
    _M_realloc_insert<Nova::Vector<int,3,true>const&>
              ((vector<Nova::Vector<int,3,true>,std::allocator<Nova::Vector<int,3,true>>> *)
               &this->elements,__position,e);
    pVVar1 = (this->elements)._data.
             super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->_data)._M_elems[2] = (e->_data)._M_elems[2];
    *(undefined8 *)((__position._M_current)->_data)._M_elems = *(undefined8 *)(e->_data)._M_elems;
    pVVar1 = (this->elements)._data.
             super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->elements)._data.
    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  return (int)((ulong)((long)pVVar1 -
                      (long)(this->elements)._data.
                            super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
}

Assistant:

unsigned Add_Element(const INDEX& e)
    {
        elements.Append(e);
        return elements.size();
    }